

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectOneType(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int Type1,int Type2)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *vRes;
  int i;
  Wlc_Obj_t *pObj;
  int Type2_local;
  int Type1_local;
  Vec_Int_t *vMemObjsClean_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (vRes._4_4_ = 0; iVar1 = Vec_IntSize(vMemObjsClean), vRes._4_4_ < iVar1;
      vRes._4_4_ = vRes._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vMemObjsClean,vRes._4_4_);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjType(pObj_00);
    if ((iVar1 == Type1) || (iVar1 = Wlc_ObjType(pObj_00), iVar1 == Type2)) {
      iVar1 = Wlc_ObjId(p,pObj_00);
      Vec_IntPush(p_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectOneType( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int Type1, int Type2 )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        if ( Wlc_ObjType(pObj) == Type1 || Wlc_ObjType(pObj) == Type2 )
            Vec_IntPush( vRes, Wlc_ObjId(p, pObj) );
    return vRes;
}